

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O1

void png_set_text_compression_window_bits(png_structrp png_ptr,int window_bits)

{
  char *warning_message;
  
  if (png_ptr == (png_structrp)0x0) {
    return;
  }
  if (window_bits < 0x10) {
    if (7 < window_bits) goto LAB_00129104;
    window_bits = 8;
    warning_message = "Only compression windows >= 256 supported by PNG";
  }
  else {
    window_bits = 0xf;
    warning_message = "Only compression windows <= 32k supported by PNG";
  }
  png_warning(png_ptr,warning_message);
LAB_00129104:
  png_ptr->zlib_text_window_bits = window_bits;
  return;
}

Assistant:

void PNGAPI
png_set_text_compression_window_bits(png_structrp png_ptr, int window_bits)
{
   png_debug(1, "in png_set_text_compression_window_bits");

   if (png_ptr == NULL)
      return;

   if (window_bits > 15)
   {
      png_warning(png_ptr, "Only compression windows <= 32k supported by PNG");
      window_bits = 15;
   }

   else if (window_bits < 8)
   {
      png_warning(png_ptr, "Only compression windows >= 256 supported by PNG");
      window_bits = 8;
   }

   png_ptr->zlib_text_window_bits = window_bits;
}